

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O3

void TestMap<TCMalloc_PageMap3<20>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_t __i;
  AssertHelperData *pAVar4;
  long lVar5;
  Number i2;
  Node *pNVar6;
  uint uVar7;
  Number i3;
  char *pcVar8;
  AssertHelperData *n;
  AssertHelperData *pAVar9;
  undefined1 local_1410 [8];
  TCMalloc_PageMap3<20> map;
  AssertHelper local_78;
  bool local_69;
  internal iStack_68;
  bool limit_is_below_the_overflow_boundary_local;
  vector<long,_std::allocator<long>_> elements;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  local_69 = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n");
  map.root_.ptrs[0x7f] = (Node *)malloc;
  memset(local_1410,0,0x400);
  n = (AssertHelperData *)(long)limit;
  if (0 < limit) {
    pAVar4 = (AssertHelperData *)0x0;
    do {
      TCMalloc_PageMap3<20>::Ensure((TCMalloc_PageMap3<20> *)local_1410,(Number)pAVar4,1);
      pAVar9 = (AssertHelperData *)((long)&pAVar4->type + 1);
      uVar3 = (uint)((ulong)pAVar4 >> 6) & 0x7f;
      uVar7 = (uint)pAVar4 & 0x3f;
      map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1]->ptrs[uVar3]->ptrs[uVar7] = (Node *)pAVar9;
      if (pAVar4 < (AssertHelperData *)0x100000) {
        pNVar6 = map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1];
        if ((pNVar6 == (Node *)0x0) || (pNVar6 = pNVar6->ptrs[uVar3], pNVar6 == (Node *)0x0)) {
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pNVar6->ptrs[uVar7];
        }
      }
      else {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      local_38.data_ = pAVar9;
      testing::internal::CmpHelperEQ<void*,void*>
                (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                 &local_38.data_);
      if (iStack_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start == (pointer)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3b,pcVar8);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
        goto LAB_0010a71a;
      }
      if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&elements,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start);
      }
      pAVar4 = pAVar9;
    } while (pAVar9 != n);
    if (0 < limit) {
      pAVar4 = (AssertHelperData *)0x0;
      do {
        if ((pAVar4 < (AssertHelperData *)0x100000) &&
           (pNVar6 = map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1], pNVar6 != (Node *)0x0)) {
          pNVar6 = pNVar6->ptrs[(uint)((ulong)pAVar4 >> 6) & 0x7f];
          if (pNVar6 == (Node *)0x0) goto LAB_00109fd2;
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pNVar6->ptrs[(uint)pAVar4 & 0x3f];
        }
        else {
LAB_00109fd2:
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
        local_38.data_ = pAVar4;
        testing::internal::CmpHelperEQ<void*,void*>
                  (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                   &local_38.data_);
        if (iStack_68 == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x3e,pcVar8);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
          goto LAB_0010a71a;
        }
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&elements,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
      } while (n != pAVar4);
      map.root_.ptrs[0x7f] = (Node *)malloc;
      memset((TCMalloc_PageMap3<20> *)local_1410,0,0x400);
      TCMalloc_PageMap3<20>::Ensure((TCMalloc_PageMap3<20> *)local_1410,0,(size_t)n);
      if (0 < limit) {
        pAVar4 = (AssertHelperData *)0x0;
        do {
          pAVar9 = (AssertHelperData *)((long)&pAVar4->type + 1);
          uVar3 = (uint)((ulong)pAVar4 >> 6) & 0x7f;
          uVar7 = (uint)pAVar4 & 0x3f;
          map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1]->ptrs[uVar3]->ptrs[uVar7] = (Node *)pAVar9;
          if (((pAVar4 < (AssertHelperData *)0x100000) &&
              (pNVar6 = map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1], pNVar6 != (Node *)0x0)) &&
             (pNVar6 = pNVar6->ptrs[uVar3], pNVar6 != (Node *)0x0)) {
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pNVar6->ptrs[uVar7];
          }
          else {
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          local_38.data_ = pAVar9;
          testing::internal::CmpHelperEQ<void*,void*>
                    (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                     &local_38.data_);
          if (iStack_68 == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                       ,0x47,pcVar8);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
            goto LAB_0010a71a;
          }
          if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&elements,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
          }
          pAVar4 = pAVar9;
        } while (n != pAVar9);
        if (0 < limit) {
          pAVar4 = (AssertHelperData *)0x0;
          do {
            if ((pAVar4 < (AssertHelperData *)0x100000) &&
               (pNVar6 = map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1], pNVar6 != (Node *)0x0)) {
              pNVar6 = pNVar6->ptrs[(uint)((ulong)pAVar4 >> 6) & 0x7f];
              if (pNVar6 == (Node *)0x0) goto LAB_0010a160;
              local_48._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pNVar6->ptrs[(uint)pAVar4 & 0x3f];
            }
            else {
LAB_0010a160:
              local_48._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
            local_38.data_ = pAVar4;
            testing::internal::CmpHelperEQ<void*,void*>
                      (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                       &local_38.data_);
            if (iStack_68 == (internal)0x0) {
              testing::Message::Message((Message *)&local_48);
              if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                         ,0x4a,pcVar8);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
LAB_0010a71a:
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if (local_48._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_48._M_head_impl + 8))();
              }
              if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                return;
              }
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&elements,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
              return;
            }
            if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&elements,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
            }
          } while (n != pAVar4);
        }
      }
      goto LAB_0010a1da;
    }
  }
  map.root_.ptrs[0x7f] = (Node *)malloc;
  memset((TCMalloc_PageMap3<20> *)local_1410,0,0x400);
  TCMalloc_PageMap3<20>::Ensure((TCMalloc_PageMap3<20> *)local_1410,0,(size_t)n);
LAB_0010a1da:
  map.root_.ptrs[0x7f] = (Node *)malloc;
  memset((TCMalloc_PageMap3<20> *)local_1410,0,0x400);
  bVar2 = TCMalloc_PageMap3<20>::Ensure
                    ((TCMalloc_PageMap3<20> *)local_1410,(Number)n,(long)(limit + 1));
  local_48._M_head_impl._0_1_ = (internal)bVar2;
  testing::internal::CmpHelperEQ<bool,bool>
            (&stack0xffffffffffffff98,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",(bool *)&local_48,&local_69);
  if (iStack_68 == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar8);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&elements,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start);
  }
  if (iStack_68 != (internal)0x0) {
    _iStack_68 = (long *)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1410 = (undefined1  [8])0x0;
    if (0 < limit) {
      do {
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start ==
            elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&stack0xffffffffffffff98,
                     (iterator)
                     elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start,(long *)local_1410);
        }
        else {
          *elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start = (long)local_1410;
          elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        }
        local_1410 = (undefined1  [8])((long)(Node **)local_1410 + 1);
      } while ((long)local_1410 < (long)n);
    }
    local_1410 = (undefined1  [8])0x2a;
    lVar5 = 1;
    pNVar6 = (Node *)0x2a;
    do {
      pNVar6 = (Node *)(ulong)(((uint)((ulong)pNVar6 >> 0x1e) ^ (uint)pNVar6) * 0x6c078965 +
                              (int)lVar5);
      map.root_.ptrs[lVar5 + -1] = pNVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (_iStack_68,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_1410);
    map.root_.ptrs[0x7f] = (Node *)malloc;
    memset(local_1410,0,0x400);
    if (0 < limit) {
      pAVar4 = (AssertHelperData *)0x0;
      do {
        TCMalloc_PageMap3<20>::Ensure
                  ((TCMalloc_PageMap3<20> *)local_1410,_iStack_68[(long)pAVar4],1);
        uVar1 = _iStack_68[(long)pAVar4];
        *(ulong *)(*(long *)((long)map.root_.ptrs[(uVar1 >> 0xd) - 1]->ptrs +
                            (ulong)((uint)uVar1 >> 3 & 0x3f8)) + (ulong)((uint)uVar1 & 0x3f) * 8) =
             uVar1 + 1;
        uVar1 = _iStack_68[(long)pAVar4];
        if ((uVar1 < 0x100000) &&
           (pNVar6 = map.root_.ptrs[(uVar1 >> 0xd) - 1], pNVar6 != (Node *)0x0)) {
          pNVar6 = pNVar6->ptrs[(uint)(uVar1 >> 6) & 0x7f];
          if (pNVar6 == (Node *)0x0) goto LAB_0010a47f;
          local_38.data_ = (AssertHelperData *)pNVar6->ptrs[(uint)uVar1 & 0x3f];
        }
        else {
LAB_0010a47f:
          local_38.data_ = (AssertHelperData *)0x0;
        }
        local_78.data_ = (AssertHelperData *)(uVar1 + 1);
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_48,"map.get(elements[i])","(void*)(elements[i]+1)",
                   &local_38.data_,&local_78.data_);
        if (local_48._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar8 = "";
          }
          else {
            pcVar8 = (local_40->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x5d,pcVar8);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_38);
          goto LAB_0010a694;
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
        pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
      } while (n != pAVar4);
      if (0 < limit) {
        pAVar4 = (AssertHelperData *)0x0;
LAB_0010a4ec:
        if ((pAVar4 < (AssertHelperData *)0x100000) &&
           (pNVar6 = map.root_.ptrs[((ulong)pAVar4 >> 0xd) - 1], pNVar6 != (Node *)0x0)) {
          pNVar6 = pNVar6->ptrs[(uint)((ulong)pAVar4 >> 6) & 0x7f];
          if (pNVar6 == (Node *)0x0) goto LAB_0010a525;
          local_38.data_ = (AssertHelperData *)pNVar6->ptrs[(uint)pAVar4 & 0x3f];
        }
        else {
LAB_0010a525:
          local_38.data_ = (AssertHelperData *)0x0;
        }
        pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
        local_78.data_ = pAVar4;
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_48,"map.get(i)","(void*)(i+1)",&local_38.data_,&local_78.data_
                  );
        if (local_48._M_head_impl._0_1_ != (internal)0x0) goto code_r0x0010a554;
        testing::Message::Message((Message *)&local_38);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x60,pcVar8);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_38);
LAB_0010a694:
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_38.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_38.data_ + 8))();
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
      }
    }
LAB_0010a6be:
    if (_iStack_68 != (long *)0x0) {
      operator_delete(_iStack_68,
                      (long)elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)_iStack_68);
    }
  }
  return;
code_r0x0010a554:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (n == pAVar4) goto LAB_0010a6be;
  goto LAB_0010a4ec;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}